

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow-c.cpp
# Opt level: O0

int arrow_array_stream_wrapper::anon_unknown_0::GetNext(ArrowArrayStream *stream,ArrowArray *out)

{
  long lVar1;
  void *in_RSI;
  long in_RDI;
  PrivateData *private_data;
  
  lVar1 = *(long *)(in_RDI + 0x20);
  memcpy(in_RSI,*(void **)(lVar1 + 8),0x50);
  if ((*(byte *)(lVar1 + 0x10) & 1) == 0) {
    *(code **)((long)in_RSI + 0x40) = EmptyArrayRelease;
  }
  else {
    *(undefined8 *)((long)in_RSI + 0x40) = 0;
  }
  *(undefined1 *)(lVar1 + 0x10) = 1;
  return 0;
}

Assistant:

int GetNext(struct ArrowArrayStream *stream, struct ArrowArray *out) {
	auto private_data = static_cast<arrow_array_stream_wrapper::PrivateData *>((stream->private_data));
	*out = *private_data->array;
	if (private_data->done) {
		out->release = nullptr;
	} else {
		out->release = EmptyArrayRelease;
	}

	private_data->done = true;
	return DuckDBSuccess;
}